

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::i64_Trunc_f64s(w3Interp *this)

{
  double dVar1;
  pointer pwVar2;
  Value *pVVar3;
  
  pVVar3 = w3Stack::value(&this->super_w3Stack,Tag_f64);
  dVar1 = pVVar3->f64;
  w3Stack::AssertTopIsValue(&this->super_w3Stack);
  pwVar2 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pwVar2[-1].value.tag = Tag_i64;
  pwVar2[-1].value.value.u64 = (long)dVar1;
  return;
}

Assistant:

INTERP (i64_Trunc_f64s)
{
    set_i64 ((int64_t)f64 ());
}